

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::LowBDConvolveScaleTest_DISABLED_Speed_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::LowBDConvolveScaleTest_DISABLED_Speed_Test>
           *this)

{
  LowBDConvolveScaleTest *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*),std::tuple<int,int>>>
  ::parameter_ = &this->parameter_;
  this_00 = (LowBDConvolveScaleTest *)operator_new(0x80);
  anon_unknown.dwarf_1ef7149::LowBDConvolveScaleTest::LowBDConvolveScaleTest(this_00);
  (this_00->super_ConvolveScaleTestBase<unsigned_char>).super_Test._vptr_Test =
       (_func_int **)&PTR__LowBDConvolveScaleTest_00f6fec0;
  (this_00->
  super_WithParamInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
  )._vptr_WithParamInterface =
       (_func_int **)&PTR__LowBDConvolveScaleTest_DISABLED_Speed_Test_00f6ff08;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }